

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t setup_current_filesystem(archive_read_disk *a)

{
  tree *t_00;
  wchar_t wVar1;
  char *__file;
  int *piVar2;
  wchar_t local_114;
  wchar_t fd;
  wchar_t xr;
  wchar_t vr;
  wchar_t r;
  statvfs svfs;
  statfs sfs;
  tree *t;
  archive_read_disk *a_local;
  
  t_00 = a->tree;
  local_114 = L'\0';
  wVar1 = tree_current_is_symblic_link_target(t_00);
  if (wVar1 == L'\0') {
    wVar1 = tree_current_dir_fd(t_00);
    fd = fstatvfs(wVar1,(statvfs *)&vr);
    wVar1 = tree_current_dir_fd(t_00);
    xr = fstatfs(wVar1,(statfs *)(svfs.__f_spare + 4));
    if (xr == L'\0') {
      wVar1 = tree_current_dir_fd(t_00);
      local_114 = get_xfer_size(t_00,wVar1,(char *)0x0);
    }
  }
  else {
    wVar1 = tree_current_dir_fd(t_00);
    __file = tree_current_access_path(t_00);
    wVar1 = openat(wVar1,__file,0x80000);
    __archive_ensure_cloexec_flag(wVar1);
    if (wVar1 < L'\0') {
      piVar2 = __errno_location();
      archive_set_error(&a->archive,*piVar2,"openat failed");
      return L'\xffffffe7';
    }
    fd = fstatvfs(wVar1,(statvfs *)&vr);
    xr = fstatfs(wVar1,(statfs *)(svfs.__f_spare + 4));
    if (xr == L'\0') {
      local_114 = get_xfer_size(t_00,wVar1,(char *)0x0);
    }
    close(wVar1);
  }
  if (((xr == L'\xffffffff') || (local_114 == L'\xffffffff')) || (fd == L'\xffffffff')) {
    t_00->current_filesystem->synthetic = -1;
    t_00->current_filesystem->remote = -1;
    piVar2 = __errno_location();
    archive_set_error(&a->archive,*piVar2,"statfs failed");
    return L'\xffffffe7';
  }
  if (local_114 == L'\x01') {
    set_statvfs_transfer_size(t_00->current_filesystem,(statvfs *)&vr);
  }
  if (svfs.__f_spare._16_8_ == 0x1373) {
LAB_0017c29e:
    t_00->current_filesystem->remote = 0;
    t_00->current_filesystem->synthetic = 1;
  }
  else {
    if (((svfs.__f_spare._16_8_ != 0x517b) && (svfs.__f_spare._16_8_ != 0x564c)) &&
       (svfs.__f_spare._16_8_ != 0x6969)) {
      if ((svfs.__f_spare._16_8_ == 0x9fa0) || (svfs.__f_spare._16_8_ == 0x9fa2)) goto LAB_0017c29e;
      if (((svfs.__f_spare._16_8_ != 0x5346414f) && (svfs.__f_spare._16_8_ != 0x73757245)) &&
         (svfs.__f_spare._16_8_ != 0xff534d42)) {
        t_00->current_filesystem->remote = 0;
        t_00->current_filesystem->synthetic = 0;
        goto LAB_0017c2e8;
      }
    }
    t_00->current_filesystem->remote = 1;
    t_00->current_filesystem->synthetic = 0;
  }
LAB_0017c2e8:
  if ((svfs.f_fsid & 0x400) == 0) {
    t_00->current_filesystem->noatime = 0;
  }
  else {
    t_00->current_filesystem->noatime = 1;
  }
  return L'\0';
}

Assistant:

static int
setup_current_filesystem(struct archive_read_disk *a)
{
	struct tree *t = a->tree;
	struct statfs sfs;
#if defined(HAVE_GETVFSBYNAME) && defined(VFCF_SYNTHETIC)
/* TODO: configure should set GETVFSBYNAME_ARG_TYPE to make
 * this accurate; some platforms have both and we need the one that's
 * used by getvfsbyname()
 *
 * Then the following would become:
 *  #if defined(GETVFSBYNAME_ARG_TYPE)
 *   GETVFSBYNAME_ARG_TYPE vfc;
 *  #endif
 */
#  if defined(HAVE_STRUCT_XVFSCONF)
	struct xvfsconf vfc;
#  else
	struct vfsconf vfc;
#  endif
#endif
	int r, xr = 0;
#if !defined(HAVE_STRUCT_STATFS_F_NAMEMAX)
	long nm;
#endif

	t->current_filesystem->synthetic = -1;
	t->current_filesystem->remote = -1;
	if (tree_current_is_symblic_link_target(t)) {
#if defined(HAVE_OPENAT)
		/*
		 * Get file system statistics on any directory
		 * where current is.
		 */
		int fd = openat(tree_current_dir_fd(t),
		    tree_current_access_path(t), O_RDONLY | O_CLOEXEC);
		__archive_ensure_cloexec_flag(fd);
		if (fd < 0) {
			archive_set_error(&a->archive, errno,
			    "openat failed");
			return (ARCHIVE_FAILED);
		}
		r = fstatfs(fd, &sfs);
		if (r == 0)
			xr = get_xfer_size(t, fd, NULL);
		close(fd);
#else
		if (tree_enter_working_dir(t) != 0) {
			archive_set_error(&a->archive, errno, "fchdir failed");
			return (ARCHIVE_FAILED);
		}
		r = statfs(tree_current_access_path(t), &sfs);
		if (r == 0)
			xr = get_xfer_size(t, -1, tree_current_access_path(t));
#endif
	} else {
		r = fstatfs(tree_current_dir_fd(t), &sfs);
		if (r == 0)
			xr = get_xfer_size(t, tree_current_dir_fd(t), NULL);
	}
	if (r == -1 || xr == -1) {
		archive_set_error(&a->archive, errno, "statfs failed");
		return (ARCHIVE_FAILED);
	} else if (xr == 1) {
		/* pathconf(_PC_REX_*) operations are not supported. */
		set_statfs_transfer_size(t->current_filesystem, &sfs);
	}
	if (sfs.f_flags & MNT_LOCAL)
		t->current_filesystem->remote = 0;
	else
		t->current_filesystem->remote = 1;

#if defined(HAVE_GETVFSBYNAME) && defined(VFCF_SYNTHETIC)
	r = getvfsbyname(sfs.f_fstypename, &vfc);
	if (r == -1) {
		archive_set_error(&a->archive, errno, "getvfsbyname failed");
		return (ARCHIVE_FAILED);
	}
	if (vfc.vfc_flags & VFCF_SYNTHETIC)
		t->current_filesystem->synthetic = 1;
	else
		t->current_filesystem->synthetic = 0;
#endif

#if defined(MNT_NOATIME)
	if (sfs.f_flags & MNT_NOATIME)
		t->current_filesystem->noatime = 1;
	else
#endif
		t->current_filesystem->noatime = 0;

#if defined(USE_READDIR_R)
	/* Set maximum filename length. */
#if defined(HAVE_STRUCT_STATFS_F_NAMEMAX)
	t->current_filesystem->name_max = sfs.f_namemax;
#else
# if defined(_PC_NAME_MAX)
	/* Mac OS X does not have f_namemax in struct statfs. */
	if (tree_current_is_symblic_link_target(t)) {
		if (tree_enter_working_dir(t) != 0) {
			archive_set_error(&a->archive, errno, "fchdir failed");
			return (ARCHIVE_FAILED);
		}
		nm = pathconf(tree_current_access_path(t), _PC_NAME_MAX);
	} else
		nm = fpathconf(tree_current_dir_fd(t), _PC_NAME_MAX);
# else
	nm = -1;
# endif
	if (nm == -1)
		t->current_filesystem->name_max = NAME_MAX;
	else
		t->current_filesystem->name_max = nm;
#endif
	if (t->current_filesystem->name_max == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Cannot determine name_max");
		return (ARCHIVE_FAILED);
	}
#endif /* USE_READDIR_R */
	return (ARCHIVE_OK);
}